

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseBufferTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::PixelPackBufferStorageTestCase::execute
          (PixelPackBufferStorageTestCase *this,GLuint sparse_bo_storage_flags)

{
  GLenum GVar1;
  int iVar2;
  TestError *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar3;
  byte local_20b;
  byte local_20a;
  byte local_209;
  MessageBuilder local_1f0;
  bool local_6e;
  byte local_6d;
  uint local_6c;
  bool is_from_committed_page;
  uint uStack_68;
  uchar expected_value;
  uint n_component;
  uint x;
  uint y;
  uchar *reference_data_traveller_ptr;
  uchar *read_data_traveller_ptr;
  uchar *puStack_48;
  uint n_current_tex_data_byte;
  uchar *read_data_ptr;
  undefined1 local_29;
  uint local_28;
  uint uStack_24;
  bool should_commit;
  uint n_page;
  uint n_pages;
  bool result_local;
  uint n_iteration;
  bool result;
  PixelPackBufferStorageTestCase *pPStack_10;
  GLuint sparse_bo_storage_flags_local;
  PixelPackBufferStorageTestCase *this_local;
  
  result_local = true;
  n_iteration = sparse_bo_storage_flags;
  pPStack_10 = this;
  (*this->m_gl->bindBuffer)(0x8f36,this->m_helper_bo);
  (*this->m_gl->bindBuffer)(0x88eb,this->m_sparse_bo);
  GVar1 = (*this->m_gl->getError)();
  glu::checkError(GVar1,"glBindBuffer() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0xc16);
  n_pages = 0;
  do {
    if (2 < n_pages) {
      return (bool)(result_local & 1);
    }
    n_page._3_1_ = 1;
    if (n_pages == 0) {
      (*this->m_gl->bufferPageCommitmentARB)(0x88eb,0,(ulong)this->m_sparse_bo_size_rounded,'\x01');
      GVar1 = (*this->m_gl->getError)();
      glu::checkError(GVar1,"glBufferPageCommitmentARB() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0xc29);
    }
    else if (n_pages == 1) {
      uStack_24 = this->m_ref_data_size / (uint)this->m_page_size + 1;
      for (local_28 = 0; local_28 < uStack_24; local_28 = local_28 + 1) {
        local_29 = (local_28 & 1) == 0;
        (*this->m_gl->bufferPageCommitmentARB)
                  (0x88eb,(ulong)(this->m_page_size * local_28),(long)this->m_page_size,local_29);
        GVar1 = (*this->m_gl->getError)();
        glu::checkError(GVar1,"glBufferPageCommitmentARB() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                        ,0xc3a);
      }
    }
    else if (n_pages != 2) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid iteration index",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                 ,0xc48);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    puStack_48 = (uchar *)0x0;
    (*this->m_gl->useProgram)(this->m_po);
    GVar1 = (*this->m_gl->getError)();
    glu::checkError(GVar1,"glUseProgram() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0xc50);
    (*this->m_gl->drawArrays)(5,0,4);
    GVar1 = (*this->m_gl->getError)();
    glu::checkError(GVar1,"glDrawArrays() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0xc53);
    (*this->m_gl->readPixels)
              (0,0,this->m_color_rb_width,this->m_color_rb_height,0x1908,0x1401,(void *)0x0);
    GVar1 = (*this->m_gl->getError)();
    glu::checkError(GVar1,"glReadPixels() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0xc59);
    (*this->m_gl->copyBufferSubData)(0x88eb,0x8f36,0,0,(ulong)this->m_ref_data_size);
    GVar1 = (*this->m_gl->getError)();
    glu::checkError(GVar1,"glCopyBufferSubData() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0xc5e);
    puStack_48 = (uchar *)(*this->m_gl->mapBufferRange)(0x8f36,0,(ulong)this->m_ref_data_size,1);
    GVar1 = (*this->m_gl->getError)();
    glu::checkError(GVar1,"glMapBufferRange() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0xc63);
    read_data_traveller_ptr._4_4_ = 0;
    reference_data_traveller_ptr = puStack_48;
    _x = this->m_ref_data_ptr;
    n_component = 0;
    while( true ) {
      local_209 = 0;
      if (n_component < this->m_color_rb_height) {
        local_209 = n_page._3_1_;
      }
      if ((local_209 & 1) == 0) break;
      uStack_68 = 0;
      while( true ) {
        local_20a = 0;
        if (uStack_68 < this->m_color_rb_width) {
          local_20a = n_page._3_1_;
        }
        if ((local_20a & 1) == 0) break;
        local_6c = 0;
        while( true ) {
          local_20b = 0;
          if (local_6c < 4) {
            local_20b = n_page._3_1_;
          }
          if ((local_20b & 1) == 0) break;
          local_6d = 0;
          if (n_pages == 1) {
            local_6e = ((ulong)read_data_traveller_ptr._4_4_ / (ulong)(uint)this->m_page_size & 1)
                       == 0;
          }
          else {
            local_6e = n_pages != 2;
          }
          if (local_6e != false) {
            local_6d = *_x;
            iVar2 = de::abs<int>((uint)local_6d - (uint)*reference_data_traveller_ptr);
            if (1 < iVar2) {
              this_01 = tcu::TestContext::getLog(this->m_testCtx);
              tcu::TestLog::operator<<
                        (&local_1f0,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
              pMVar3 = tcu::MessageBuilder::operator<<
                                 (&local_1f0,(char (*) [29])"Invalid texel data (channel:");
              pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_6c);
              pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [14])") found at X:");
              pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&stack0xffffffffffffff98);
              pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [5])", Y:");
              pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&n_component);
              pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [19])"). Expected value:");
              pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_6d);
              pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [15])", found value:");
              pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,_x);
              tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::MessageBuilder::~MessageBuilder(&local_1f0);
              n_page._3_1_ = 0;
            }
          }
          read_data_traveller_ptr._4_4_ = read_data_traveller_ptr._4_4_ + 1;
          reference_data_traveller_ptr = reference_data_traveller_ptr + 1;
          _x = _x + 1;
          local_6c = local_6c + 1;
        }
        uStack_68 = uStack_68 + 1;
      }
      n_component = n_component + 1;
    }
    (*this->m_gl->unmapBuffer)(0x8f36);
    GVar1 = (*this->m_gl->getError)();
    glu::checkError(GVar1,"glUnmapBuffer() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0xc99);
    puStack_48 = (uchar *)0x0;
    result_local = (result_local & 1U & n_page._3_1_ & 1) != 0;
    (*this->m_gl->bufferPageCommitmentARB)(0x88eb,0,(ulong)this->m_sparse_bo_size_rounded,'\0');
    GVar1 = (*this->m_gl->getError)();
    glu::checkError(GVar1,"glBufferPageCommitmentARB() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0xca1);
    n_pages = n_pages + 1;
  } while( true );
}

Assistant:

bool PixelPackBufferStorageTestCase::execute(glw::GLuint sparse_bo_storage_flags)
{
	(void)sparse_bo_storage_flags;
	bool result = true;

	m_gl.bindBuffer(GL_COPY_READ_BUFFER, m_helper_bo);
	m_gl.bindBuffer(GL_PIXEL_PACK_BUFFER, m_sparse_bo);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindBuffer() call(s) failed.");

	/* Run three separate iterations:
	 *
	 * a) All pages that are going to hold the texture data are committed.
	 * b) Use a zig-zag memory page commitment layout patern.
	 * b) No pages are committed.
	 */
	for (unsigned int n_iteration = 0; n_iteration < 3; ++n_iteration)
	{
		bool result_local = true;

		/* Set up the memory page commitment & the storage contents*/
		switch (n_iteration)
		{
		case 0:
		{
			m_gl.bufferPageCommitmentARB(GL_PIXEL_PACK_BUFFER, 0,			 /* offset */
										 m_sparse_bo_size_rounded, GL_TRUE); /* commit */
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferPageCommitmentARB() call failed.");

			break;
		}

		case 1:
		{
			const unsigned int n_pages = 1 + m_ref_data_size / m_page_size;

			DE_ASSERT((m_ref_data_size % m_page_size) == 0);

			for (unsigned int n_page = 0; n_page < n_pages; ++n_page)
			{
				const bool should_commit = ((n_page % 2) == 0);

				m_gl.bufferPageCommitmentARB(GL_PIXEL_PACK_BUFFER, m_page_size * n_page, m_page_size,
											 should_commit ? GL_TRUE : GL_FALSE);
				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferPageCommitmentARB() call failed.");
			} /* for (all relevant memory pages) */

			break;
		}

		case 2:
		{
			/* Do nothing - all pages already de-committed  */
			break;
		}

		default:
		{
			TCU_FAIL("Invalid iteration index");
		}
		} /* switch (n_iteration) */

		/* Draw full screen quad to generate the black-to-white gradient */
		const unsigned char* read_data_ptr = NULL;

		m_gl.useProgram(m_po);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glUseProgram() call failed.");

		m_gl.drawArrays(GL_TRIANGLE_STRIP, 0 /* first */, 4 /* count */);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glDrawArrays() call failed.");

		/* Read a framebuffer pixel data */
		m_gl.readPixels(0,																	/* x */
						0,																	/* y */
						m_color_rb_width, m_color_rb_height, GL_RGBA, GL_UNSIGNED_BYTE, 0); /* pixels */
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glReadPixels() call failed.");

		m_gl.copyBufferSubData(GL_PIXEL_PACK_BUFFER, GL_COPY_READ_BUFFER, 0, /* readOffset */
							   0,											 /* writeOffset */
							   m_ref_data_size);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glCopyBufferSubData() call failed.");

		read_data_ptr = (unsigned char*)m_gl.mapBufferRange(GL_COPY_READ_BUFFER, 0, /* offset */
															m_ref_data_size, GL_MAP_READ_BIT);

		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glMapBufferRange() call failed.");

		/* Verify the data */
		unsigned int		 n_current_tex_data_byte	  = 0;
		const unsigned char* read_data_traveller_ptr	  = (const unsigned char*)read_data_ptr;
		const unsigned char* reference_data_traveller_ptr = (const unsigned char*)m_ref_data_ptr;

		for (unsigned int y = 0; y < m_color_rb_height && result_local; ++y)
		{
			for (unsigned int x = 0; x < m_color_rb_width && result_local; ++x)
			{
				for (unsigned int n_component = 0; n_component < 4 /* rgba */ && result_local; ++n_component)
				{
					unsigned char expected_value		 = 0;
					bool		  is_from_committed_page = true;

					if (n_iteration == 1) /* zig-zag */
					{
						is_from_committed_page = ((n_current_tex_data_byte / m_page_size) % 2) == 0;
					}
					else if (n_iteration == 2) /* no pages committed */
					{
						is_from_committed_page = false;
					}

					if (is_from_committed_page)
					{
						expected_value = *reference_data_traveller_ptr;
					}

					if (is_from_committed_page && de::abs(expected_value - *read_data_traveller_ptr) > 1)
					{
						m_testCtx.getLog() << tcu::TestLog::Message << "Invalid texel data (channel:" << n_component
										   << ")"
											  " found at X:"
										   << x << ", "
												   "Y:"
										   << y << ")."
												   " Expected value:"
										   << expected_value << ","
																" found value:"
										   << *reference_data_traveller_ptr << tcu::TestLog::EndMessage;

						result_local = false;
					}

					n_current_tex_data_byte++;
					read_data_traveller_ptr++;
					reference_data_traveller_ptr++;
				} /* for (all components) */
			}	 /* for (all columns) */
		}		  /* for (all rows) */

		m_gl.unmapBuffer(GL_COPY_READ_BUFFER);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glUnmapBuffer() call failed.");

		read_data_ptr = DE_NULL;
		result &= result_local;

		/* Clean up */
		m_gl.bufferPageCommitmentARB(GL_PIXEL_PACK_BUFFER, 0,			  /* offset */
									 m_sparse_bo_size_rounded, GL_FALSE); /* commit */
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferPageCommitmentARB() call failed.");
	} /* for (three iterations) */

	return result;
}